

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O1

uc_err reg_write_mips(void *_env,int mode,uint regid,void *value,size_t *size,int *setpc)

{
  ulong uVar1;
  uc_err uVar2;
  uint uVar3;
  uint uVar4;
  
  if (regid - 2 < 0x20) {
    if (*size < 4) {
      return UC_ERR_OVERFLOW;
    }
    *size = 4;
    *(undefined4 *)((long)_env + (ulong)(regid - 2) * 4) = *value;
  }
  else {
    uVar2 = UC_ERR_ARG;
    switch(regid) {
    case 0x81:
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      *(undefined4 *)((long)_env + 0x84) = *value;
      break;
    case 0x82:
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      *(undefined4 *)((long)_env + 0x94) = *value;
      break;
    case 0x83:
    case 0x84:
    case 0x85:
    case 0x86:
    case 0x87:
    case 0x88:
      goto switchD_004ab921_caseD_83;
    case 0x89:
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      *(undefined4 *)((long)_env + 0x570) = *value;
      break;
    case 0x8a:
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      *(undefined4 *)((long)_env + 0xd4) = *value;
      break;
    case 0x8b:
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      uVar3 = *value;
      *(uint *)((long)_env + 0x53c) = uVar3;
      *(uint *)((long)_env + 0x2b94) =
           (uVar3 & 4) << 0x1a | *(uint *)((long)_env + 0x2b94) & 0xc8a7fd04;
      if (((uVar3 & 6) == 0) && ((*(uint *)((long)_env + 0x2b94) & 4) == 0)) {
        *(uint *)((long)_env + 0x2b94) = *(uint *)((long)_env + 0x2b94) | uVar3 >> 3 & 3;
      }
      if ((((uVar3 >> 0x1c & 1) != 0) && ((*(byte *)((long)_env + 0x2bb1) & 0x20) == 0)) ||
         ((*(byte *)((long)_env + 0x2b94) & 3) == 0)) {
        *(byte *)((long)_env + 0x2b94) = *(byte *)((long)_env + 0x2b94) | 0x10;
      }
      if ((uVar3 >> 0x1d & 1) != 0) {
        *(byte *)((long)_env + 0x2b94) = *(byte *)((long)_env + 0x2b94) | 0x20;
      }
      if ((uVar3 >> 0x1a & 1) != 0) {
        *(byte *)((long)_env + 0x2b94) = *(byte *)((long)_env + 0x2b94) | 0x40;
      }
      if (((*(uint *)((long)_env + 0x2b94) & 3) != 0) &&
         ((*(byte *)((long)_env + 0x57c) & 0x40) != 0)) {
        *(uint *)((long)_env + 0x2b94) = *(uint *)((long)_env + 0x2b94) | 0x400000;
      }
      uVar1 = *(ulong *)((long)_env + 0x2bb0);
      if ((uVar1 >> 0x25 & 1) == 0) {
        if ((uVar1 >> 0x24 & 1) != 0) {
          uVar4 = 0x180000;
          goto LAB_004abab1;
        }
        uVar4 = 0x80000;
        if ((uVar3 >> 0x18 & 1) != 0 && (uVar1 >> 0x23 & 1) != 0) goto LAB_004abab7;
      }
      else {
        uVar4 = 0x20180000;
LAB_004abab1:
        if ((uVar3 >> 0x18 & 1) != 0) {
LAB_004abab7:
          *(uint *)((long)_env + 0x2b94) = *(uint *)((long)_env + 0x2b94) | uVar4;
        }
      }
      if ((uVar1 & 0x40) == 0) {
        if ((uVar1 & 0x20) == 0) {
          if (-1 < (int)uVar3 || (uVar1 & 8) == 0) goto LAB_004abafe;
          goto LAB_004abae1;
        }
        uVar3 = *(uint *)((long)_env + 0x2b94);
        if ((uVar3 & 8) == 0) goto LAB_004abafe;
      }
      else {
        if ((*(byte *)((long)_env + 0x432) & 0x40) == 0) goto LAB_004abafe;
LAB_004abae1:
        uVar3 = *(uint *)((long)_env + 0x2b94);
      }
      *(uint *)((long)_env + 0x2b94) = uVar3 | 0x80;
LAB_004abafe:
      if (((uVar1 >> 0x29 & 1) != 0) && ((*(byte *)((long)_env + 0x57f) & 8) != 0)) {
        *(byte *)((long)_env + 0x2b97) = *(byte *)((long)_env + 0x2b97) | 1;
      }
      if (((*(byte *)((long)_env + 0x433) & 0x20) != 0) &&
         ((*(byte *)((long)_env + 0x57d) & 1) != 0)) {
        *(byte *)((long)_env + 0x2b97) = *(byte *)((long)_env + 0x2b97) | 2;
      }
      if ((*(byte *)((long)_env + 0x570) & 0x80) == 0) {
        return UC_ERR_OK;
      }
      if ((*(byte *)((long)_env + 0x4b7) & 0x20) == 0) {
        return UC_ERR_OK;
      }
      *(byte *)((long)_env + 0x2b97) = *(byte *)((long)_env + 0x2b97) | 4;
      return UC_ERR_OK;
    default:
      if (regid != 1) {
        return UC_ERR_ARG;
      }
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      *(undefined4 *)((long)_env + 0x80) = *value;
      *setpc = 1;
    }
  }
  uVar2 = UC_ERR_OK;
switchD_004ab921_caseD_83:
  return uVar2;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_write(void *_env, int mode, unsigned int regid, const void *value,
                 size_t *size, int *setpc)
{
    CPUMIPSState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_MIPS_REG_0 && regid <= UC_MIPS_REG_31) {
        CHECK_REG_TYPE(mipsreg_t);
        env->active_tc.gpr[regid - UC_MIPS_REG_0] = *(mipsreg_t *)value;
    } else {
        switch (regid) {
        default:
            break;
        case UC_MIPS_REG_HI:
            CHECK_REG_TYPE(mipsreg_t);
            env->active_tc.HI[0] = *(mipsreg_t *)value;
            break;
        case UC_MIPS_REG_LO:
            CHECK_REG_TYPE(mipsreg_t);
            env->active_tc.LO[0] = *(mipsreg_t *)value;
            break;
        case UC_MIPS_REG_PC:
            CHECK_REG_TYPE(mipsreg_t);
            env->active_tc.PC = *(mipsreg_t *)value;
            *setpc = 1;
            break;
        case UC_MIPS_REG_CP0_CONFIG3:
            CHECK_REG_TYPE(mipsreg_t);
            env->CP0_Config3 = *(mipsreg_t *)value;
            break;
        case UC_MIPS_REG_CP0_STATUS:
            // TODO: ALL CP0 REGS
            // https://s3-eu-west-1.amazonaws.com/downloads-mips/documents/MD00090-2B-MIPS32PRA-AFP-06.02.pdf
            // https://s3-eu-west-1.amazonaws.com/downloads-mips/documents/MD00582-2B-microMIPS32-AFP-05.04.pdf
            CHECK_REG_TYPE(mipsreg_t);
            env->CP0_Status = *(mipsreg_t *)value;
            compute_hflags(env);
            break;
        case UC_MIPS_REG_CP0_USERLOCAL:
            CHECK_REG_TYPE(mipsreg_t);
            env->active_tc.CP0_UserLocal = *(mipsreg_t *)value;
            break;
        }
    }

    return ret;
}